

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::restartDoit(StateData *this,istream *is,string *chkfile)

{
  longdouble x;
  bool bVar1;
  MFInfo *pMVar2;
  pointer __p;
  BoxArray *__args;
  ulong uVar3;
  char *pcVar4;
  FabFactory<amrex::FArrayBox> *__args_5;
  int *__args_3;
  int *__args_2;
  string *in_RDX;
  istream *in_RSI;
  long in_RDI;
  literals *this_00;
  iterator fahmIter;
  char *faHeader;
  string FullHeaderPathName;
  MultiFab *whichMF;
  int ns;
  string FullPathName;
  string mf_name;
  int nsets;
  int in_stack_00000810;
  int in_stack_00000814;
  char *in_stack_00000818;
  string *in_stack_00000820;
  FabArray<amrex::FArrayBox> *in_stack_00000828;
  char *in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe32;
  char *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe50;
  MFInfo *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  DistributionMapping *in_stack_fffffffffffffe70;
  DistributionMapping *__args_1;
  BoxArray *in_stack_fffffffffffffe78;
  _Self local_148;
  _Base_ptr local_140;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>
  local_138;
  char *local_130;
  string local_128 [32];
  pointer local_108;
  int local_fc;
  string local_f8 [32];
  string local_d8 [32];
  DistributionMapping local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  int local_88;
  int local_84;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_38;
  int local_34;
  int local_24;
  string *local_20;
  istream *local_18;
  char *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::istream::operator>>(in_RSI,(double *)(in_RDI + 0xb8));
  std::istream::operator>>(local_18,(double *)(in_RDI + 0xc0));
  std::istream::operator>>(local_18,(double *)(in_RDI + 0xa8));
  std::istream::operator>>(local_18,(double *)(in_RDI + 0xb0));
  std::istream::operator>>(local_18,&local_24);
  __args_5 = (FabFactory<amrex::FArrayBox> *)(in_RDI + 0x98);
  local_34 = StateDescriptor::nComp(*(StateDescriptor **)(in_RDI + 8));
  local_38 = StateDescriptor::nExtra(*(StateDescriptor **)(in_RDI + 8));
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_48 = 0;
  MFInfo::MFInfo((MFInfo *)0x11152d8);
  pMVar2 = MFInfo::SetTag((MFInfo *)CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28);
  MFInfo::SetArena(pMVar2,*(Arena **)(in_RDI + 0xd8));
  __p = (pointer)std::
                 unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                              *)CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,__args_5);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),
             (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)__p);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
  MFInfo::~MFInfo((MFInfo *)0x111538b);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),__p);
  if (local_24 == 2) {
    __args_3 = (int *)(in_RDI + 0x30);
    __args_2 = (int *)(in_RDI + 0x98);
    local_84 = StateDescriptor::nComp(*(StateDescriptor **)(in_RDI + 8));
    local_88 = StateDescriptor::nExtra(*(StateDescriptor **)(in_RDI + 8));
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_b8.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98 = 0;
    __args_1 = &local_b8;
    MFInfo::MFInfo((MFInfo *)0x1115426);
    pMVar2 = MFInfo::SetTag((MFInfo *)CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),
                            (char *)__p);
    __args = (BoxArray *)MFInfo::SetArena(pMVar2,*(Arena **)(in_RDI + 0xd8));
    __p = (pointer)std::
                   unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                                *)CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
              (__args,__args_1,__args_2,__args_3,in_stack_fffffffffffffe58,__args_5);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)__p);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
    MFInfo::~MFInfo((MFInfo *)0x11154cd);
  }
  if (local_24 == 0) {
    this_00 = (literals *)(in_RDI + 200);
    in_stack_fffffffffffffe58 =
         (MFInfo *)
         std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                   ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1115536)
    ;
    x = (longdouble)0;
    __p = SUB108(x,0);
    in_stack_fffffffffffffe30 = (undefined2)((unkuint10)x >> 0x40);
    literals::operator____rt(this_00,x);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30),(value_type)__p);
  }
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8);
  for (local_fc = 1; local_fc <= local_24; local_fc = local_fc + 1) {
    local_108 = (pointer)0x0;
    if (local_fc == 1) {
      local_108 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
    }
    else if (local_fc == 2) {
      local_108 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
    }
    else {
      local_8 = "**** Error in StateData::restart:  invalid nsets.";
      Abort_host(in_stack_fffffffffffffe40);
    }
    std::operator>>(local_18,local_d8);
    std::__cxx11::string::operator=(local_f8,local_20);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffe50 = local_20;
      std::__cxx11::string::length();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffe50);
      if (*pcVar4 != '/') {
        std::__cxx11::string::operator+=(local_f8,'/');
      }
    }
    std::__cxx11::string::operator+=(local_f8,local_d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    local_130 = (char *)0x0;
    if (faHeaderMap_abi_cxx11_ != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>
      ::_Rb_tree_iterator(&local_138);
      local_140 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                          *)__p,(key_type *)0x1115715);
      local_138._M_node = local_140;
      local_148._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                  *)__p);
      bVar1 = std::operator!=(&local_138,&local_148);
      if (bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>
                      *)CONCAT62(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30));
        local_130 = Vector<char,_std::allocator<char>_>::dataPtr
                              ((Vector<char,_std::allocator<char>_> *)0x1115781);
      }
    }
    in_stack_fffffffffffffe40 = local_130;
    ParallelDescriptor::IOProcessorNumber();
    VisMF::Read(in_stack_00000828,in_stack_00000820,in_stack_00000818,in_stack_00000814,
                in_stack_00000810);
    std::__cxx11::string::~string(local_128);
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void
StateData::restartDoit (std::istream& is, const std::string& chkfile)
{
    BL_PROFILE("StateData::restartDoit()");

    is >> old_time.start;
    is >> old_time.stop;
    is >> new_time.start;
    is >> new_time.stop;

    int nsets;
    is >> nsets;

    new_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
    if (nsets == 2) {
        old_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                              MFInfo().SetTag("StateData").SetArena(arena),
                                              *m_factory);
    }
    //
    // If no data is written then we just allocate the MF instead of reading it in.
    // This assumes that the application will do something with it.
    // We set it to zero in case a compiler complains about uninitialized data.
    //
    if (nsets == 0) {
       new_data->setVal(0.0_rt);
    }

    std::string mf_name;
    std::string FullPathName;

    for(int ns(1); ns <= nsets; ++ns) {
        MultiFab *whichMF = nullptr;
        if(ns == 1) {
            whichMF = new_data.get();
        } else if(ns == 2) {
            whichMF = old_data.get();
        } else {
            amrex::Abort("**** Error in StateData::restart:  invalid nsets.");
        }

        is >> mf_name;
        //
        // Note that mf_name is relative to the Header file.
        // We need to prepend the name of the chkfile directory.
        //
        FullPathName = chkfile;
        if ( ! chkfile.empty() && chkfile[chkfile.length()-1] != '/') {
            FullPathName += '/';
        }
        FullPathName += mf_name;

        // ---- check for preread header
        std::string FullHeaderPathName(FullPathName + "_H");
        const char *faHeader = 0;
        if(faHeaderMap != 0) {
            std::map<std::string, Vector<char> >::iterator fahmIter;
            fahmIter = faHeaderMap->find(FullHeaderPathName);
            if(fahmIter != faHeaderMap->end()) {
                faHeader = fahmIter->second.dataPtr();
            }
        }

        VisMF::Read(*whichMF, FullPathName, faHeader);
    }
}